

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_main.c
# Opt level: O3

int optint(char *key,int opt)

{
  char *__nptr;
  long lVar1;
  char tmp [20];
  char acStack_38 [32];
  
  __nptr = skynet_getenv(key);
  if (__nptr == (char *)0x0) {
    sprintf(acStack_38,"%d",opt);
    skynet_setenv(key,acStack_38);
  }
  else {
    lVar1 = strtol(__nptr,(char **)0x0,10);
    opt = (int)lVar1;
  }
  return opt;
}

Assistant:

static int
optint(const char *key, int opt) {
	const char * str = skynet_getenv(key);
	if (str == NULL) {
		char tmp[20];
		sprintf(tmp,"%d",opt);
		skynet_setenv(key, tmp);
		return opt;
	}
	return strtol(str, NULL, 10);
}